

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitCloud.c
# Opt level: O2

CloudNode * Kit_TruthToCloud5_rec(CloudManager *dd,uint uTruth,int nVars,int nVarsAll)

{
  ulong uVar1;
  CloudNode *pCVar2;
  CloudNode *t;
  byte bVar3;
  uint uVar4;
  char *__assertion;
  uint uVar5;
  uint uVar6;
  
  uVar1 = (ulong)(uint)nVars;
  uVar4 = nVars;
  do {
    uVar1 = uVar1 - 1;
    if (5 < nVars) {
      __assertion = "nVars <= 5";
      uVar4 = 0x40;
LAB_0047a560:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitCloud.c"
                    ,uVar4,
                    "CloudNode *Kit_TruthToCloud5_rec(CloudManager *, unsigned int, int, int)");
    }
    if (uTruth == 0xffffffff) {
      return dd->one;
    }
    if (uTruth == 0) {
      return dd->zero;
    }
    if (uVar1 == 0) {
      if (uTruth == 0x55555555) {
        return (CloudNode *)((ulong)dd->vars[(long)nVarsAll + -1] ^ 1);
      }
      if (uTruth == 0xaaaaaaaa) {
        return dd->vars[(long)nVarsAll + -1];
      }
      __assertion = "0";
      uVar4 = 0x4b;
      goto LAB_0047a560;
    }
    if ((int)uVar4 < 2) {
      __assertion = "nVars > 1";
      uVar4 = 0x4e;
      goto LAB_0047a560;
    }
    uVar4 = uVar4 - 1;
    uVar6 = ~Kit_TruthToCloud5_rec::uVars[uVar1 & 0xffffffff] & uTruth;
    uVar5 = Kit_TruthToCloud5_rec::uVars[uVar1 & 0xffffffff] & uTruth;
    bVar3 = (byte)(1 << ((byte)uVar4 & 0x1f));
    uTruth = uVar6 << (bVar3 & 0x1f) | uVar6;
    uVar5 = uVar5 >> (bVar3 & 0x1f) | uVar5;
    if (uTruth != uVar5) {
      pCVar2 = Kit_TruthToCloud5_rec(dd,uTruth,uVar4,nVarsAll);
      if ((uVar5 ^ uTruth) == 0xffffffff) {
        t = (CloudNode *)((ulong)pCVar2 ^ 1);
      }
      else {
        t = Kit_TruthToCloud5_rec(dd,uVar5,uVar4,nVarsAll);
      }
      pCVar2 = Cloud_MakeNode(dd,~uVar4 + nVarsAll,t,pCVar2);
      return pCVar2;
    }
  } while( true );
}

Assistant:

CloudNode * Kit_TruthToCloud5_rec( CloudManager * dd, unsigned uTruth, int nVars, int nVarsAll )
{
    static unsigned uVars[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    CloudNode * pCof0, * pCof1;
    unsigned uCof0, uCof1;
    assert( nVars <= 5 );
    if ( uTruth == 0 )
        return dd->zero;
    if ( uTruth == ~0 )
        return dd->one;
    if ( nVars == 1 )
    {
        if ( uTruth == uVars[0] )
            return dd->vars[nVarsAll-1];
        if ( uTruth == ~uVars[0] )
            return Cloud_Not(dd->vars[nVarsAll-1]);
        assert( 0 );
    }
//    Count++;
    assert( nVars > 1 );
    uCof0 = uTruth & ~uVars[nVars-1];
    uCof1 = uTruth &  uVars[nVars-1];
    uCof0 |= uCof0 << (1<<(nVars-1));
    uCof1 |= uCof1 >> (1<<(nVars-1));
    if ( uCof0 == uCof1 )
        return Kit_TruthToCloud5_rec( dd, uCof0, nVars - 1, nVarsAll );
    if ( uCof0 == ~uCof1 )
    {
        pCof0 = Kit_TruthToCloud5_rec( dd, uCof0, nVars - 1, nVarsAll );
        pCof1 = Cloud_Not( pCof0 );
    }
    else
    {
        pCof0 = Kit_TruthToCloud5_rec( dd, uCof0, nVars - 1, nVarsAll );
        pCof1 = Kit_TruthToCloud5_rec( dd, uCof1, nVars - 1, nVarsAll );
    }
    return Cloud_MakeNode( dd, nVarsAll - nVars, pCof1, pCof0 );
}